

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_rnglists.c
# Opt level: O3

int dwarf_get_rnglist_context_basics
              (Dwarf_Debug dbg,Dwarf_Unsigned context_index,Dwarf_Unsigned *header_offset,
              Dwarf_Small *offset_size,Dwarf_Small *extension_size,uint *version,
              Dwarf_Small *address_size,Dwarf_Small *segment_selector_size,
              Dwarf_Unsigned *offset_entry_count,Dwarf_Unsigned *offset_of_offset_array,
              Dwarf_Unsigned *offset_of_first_rangeentry,Dwarf_Unsigned *offset_past_last_rangeentry
              ,Dwarf_Error *error)

{
  Dwarf_Rnglists_Context pDVar1;
  char *msg;
  
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    msg = 
    "DW_DLE_DBG_NULL: dbg argument to dwarf_get_rnglist_context_basics()either null or it containsa stale Dwarf_Debug pointer"
    ;
  }
  else {
    if (dbg->de_rnglists_context_count <= context_index) {
      return -1;
    }
    pDVar1 = dbg->de_rnglists_context[context_index];
    if (pDVar1->rc_magic == 0xabcd) {
      if (header_offset != (Dwarf_Unsigned *)0x0) {
        *header_offset = pDVar1->rc_header_offset;
      }
      if (offset_size != (Dwarf_Small *)0x0) {
        *offset_size = pDVar1->rc_offset_size;
      }
      if (extension_size != (Dwarf_Small *)0x0) {
        *extension_size = pDVar1->rc_extension_size;
      }
      if (version != (uint *)0x0) {
        *version = pDVar1->rc_version;
      }
      if (address_size != (Dwarf_Small *)0x0) {
        *address_size = pDVar1->rc_address_size;
      }
      if (segment_selector_size != (Dwarf_Small *)0x0) {
        *segment_selector_size = pDVar1->rc_segment_selector_size;
      }
      if (offset_entry_count != (Dwarf_Unsigned *)0x0) {
        *offset_entry_count = pDVar1->rc_offset_entry_count;
      }
      if (offset_of_offset_array != (Dwarf_Unsigned *)0x0) {
        *offset_of_offset_array = pDVar1->rc_offsets_off_in_sect;
      }
      if (offset_of_first_rangeentry != (Dwarf_Unsigned *)0x0) {
        *offset_of_first_rangeentry = pDVar1->rc_first_rnglist_offset;
      }
      if (offset_past_last_rangeentry == (Dwarf_Unsigned *)0x0) {
        return 0;
      }
      *offset_past_last_rangeentry = pDVar1->rc_past_last_rnglist_offset;
      return 0;
    }
    msg = 
    "DW_DLE_DBG_NULL rnglists context not RNGLISTS_MAGIC in dwarf_get_rnglist_context_basics()";
  }
  _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,msg);
  return 1;
}

Assistant:

int dwarf_get_rnglist_context_basics(
    Dwarf_Debug dbg,
    Dwarf_Unsigned context_index,
    Dwarf_Unsigned * header_offset,
    Dwarf_Small    * offset_size,
    Dwarf_Small    * extension_size,
    unsigned       * version, /* 5 */
    Dwarf_Small    * address_size,
    Dwarf_Small    * segment_selector_size,
    Dwarf_Unsigned * offset_entry_count,
    Dwarf_Unsigned * offset_of_offset_array,
    Dwarf_Unsigned * offset_of_first_rangeentry,
    Dwarf_Unsigned * offset_past_last_rangeentry,
    Dwarf_Error *error)
{
    Dwarf_Rnglists_Context con = 0;

    CHECK_DBG(dbg,error,"dwarf_get_rnglist_context_basics()");
    if (!dbg->de_rnglists_context_count) {
        return DW_DLV_NO_ENTRY;
    }
    if (context_index >= dbg->de_rnglists_context_count) {
        return DW_DLV_NO_ENTRY;
    }
    con = dbg->de_rnglists_context[context_index];
    if (con->rc_magic != RNGLISTS_MAGIC) {
        _dwarf_error_string(NULL, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL "
            "rnglists context "
            "not RNGLISTS_MAGIC "
            "in dwarf_get_rnglist_context_basics()");
        return DW_DLV_ERROR;
    }
    if (header_offset) {
        *header_offset = con->rc_header_offset;
    }
    if (offset_size) {
        *offset_size = con->rc_offset_size;
    }
    if (extension_size) {
        *extension_size = con->rc_extension_size;
    }
    if (version) {
        *version = con->rc_version;
    }
    if (address_size) {
        *address_size = con->rc_address_size;
    }
    if (segment_selector_size) {
        *segment_selector_size = con->rc_segment_selector_size;
    }
    if (offset_entry_count) {
        *offset_entry_count = con->rc_offset_entry_count;
    }
    if (offset_of_offset_array) {
        *offset_of_offset_array = con->rc_offsets_off_in_sect;
    }
    if (offset_of_first_rangeentry) {
        *offset_of_first_rangeentry = con->rc_first_rnglist_offset;
    }
    if (offset_past_last_rangeentry) {
        *offset_past_last_rangeentry =
            con->rc_past_last_rnglist_offset;
    }
    return DW_DLV_OK;
}